

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-slice.cc
# Opt level: O0

TextSlice * __thiscall
TextSlice::prefix(TextSlice *__return_storage_ptr__,TextSlice *this,uint32_t prefix_end)

{
  pair<TextSlice,_TextSlice> local_48;
  uint32_t local_14;
  TextSlice *pTStack_10;
  uint32_t prefix_end_local;
  TextSlice *this_local;
  
  local_14 = prefix_end;
  pTStack_10 = this;
  split(&local_48,this,prefix_end);
  __return_storage_ptr__->text = local_48.first.text;
  __return_storage_ptr__->start_position = local_48.first.start_position;
  __return_storage_ptr__->end_position = local_48.first.end_position;
  return __return_storage_ptr__;
}

Assistant:

TextSlice TextSlice::prefix(uint32_t prefix_end) const {
  return split(prefix_end).first;
}